

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertOrReplace.hpp
# Opt level: O3

void __thiscall njoy::ENDFtk::tree::Material::insertOrReplace(Material *this,Section *section)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  File *this_00;
  _Base_ptr p_Var3;
  int mf;
  int local_4c;
  File local_48;
  
  mf = section->mf_;
  p_Var2 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (mf <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < mf];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= mf)) goto LAB_00148648;
  }
  local_48.mat_ = this->mat_;
  local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c = mf;
  local_48.mf_ = mf;
  local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
  ::_M_emplace_unique<int,njoy::ENDFtk::tree::File>
            ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
              *)&this->files_,&local_4c,&local_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
  ::~_Rb_tree(&local_48.sections_._M_t);
  mf = section->mf_;
LAB_00148648:
  this_00 = file(this,mf);
  File::insertOrReplace(this_00,section);
  return;
}

Assistant:

void insertOrReplace( Section&& section ) {

  if ( !this->hasMF( section.MF() ) ) {

    this->files_.emplace( section.MF(), File( this->MAT(), section.MF() ) );
  }

  this->MF( section.MF() ).insertOrReplace( std::move( section ) );
}